

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::Renderer_OGL10::DrawDecal(Renderer_OGL10 *this,DecalInstance *decal)

{
  float fVar1;
  float fVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  uint local_1c;
  uint32_t n;
  DecalInstance *decal_local;
  Renderer_OGL10 *this_local;
  
  (*(this->super_Renderer)._vptr_Renderer[7])(this,&decal->mode);
  if (decal->decal == (Decal *)0x0) {
    glBindTexture(0xde1,0);
  }
  else {
    glBindTexture(0xde1,decal->decal->id);
  }
  if (this->nDecalMode == WIREFRAME) {
    glBegin(2);
  }
  else {
    glBegin(6);
  }
  for (local_1c = 0; local_1c < decal->points; local_1c = local_1c + 1) {
    pvVar6 = std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator[]
                       (&decal->tint,(ulong)local_1c);
    uVar3 = (pvVar6->field_0).field_1.r;
    pvVar6 = std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator[]
                       (&decal->tint,(ulong)local_1c);
    uVar4 = (pvVar6->field_0).field_1.g;
    pvVar6 = std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator[]
                       (&decal->tint,(ulong)local_1c);
    uVar5 = (pvVar6->field_0).field_1.b;
    pvVar6 = std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator[]
                       (&decal->tint,(ulong)local_1c);
    glColor4ub(uVar3,uVar4,uVar5,(pvVar6->field_0).field_1.a);
    pvVar7 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[](&decal->uv,(ulong)local_1c);
    fVar1 = pvVar7->x;
    pvVar7 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[](&decal->uv,(ulong)local_1c);
    fVar2 = pvVar7->y;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&decal->w,(ulong)local_1c);
    glTexCoord4f(fVar1,fVar2,0,*pvVar8);
    pvVar7 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[](&decal->pos,(ulong)local_1c);
    fVar1 = pvVar7->x;
    pvVar7 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[](&decal->pos,(ulong)local_1c);
    glVertex2f(fVar1,pvVar7->y);
  }
  glEnd();
  return;
}

Assistant:

void DrawDecal(const olc::DecalInstance &decal) override
		{
			SetDecalMode(decal.mode);

			if (decal.decal == nullptr)
				glBindTexture(GL_TEXTURE_2D, 0);
			else
				glBindTexture(GL_TEXTURE_2D, decal.decal->id);

			if (nDecalMode == DecalMode::WIREFRAME)
				glBegin(GL_LINE_LOOP);
			else
				glBegin(GL_TRIANGLE_FAN);

			for (uint32_t n = 0; n < decal.points; n++)
			{
				glColor4ub(decal.tint[n].r, decal.tint[n].g, decal.tint[n].b, decal.tint[n].a);
				glTexCoord4f(decal.uv[n].x, decal.uv[n].y, 0.0f, decal.w[n]);
				glVertex2f(decal.pos[n].x, decal.pos[n].y);
			}
			glEnd();
		}